

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdAddPubkeyHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *pubkey,char *signature,bool use_der_encode,int sighash_type,
              bool sighash_anyone_can_pay,char **tx_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AddressType address_type;
  char *pcVar3;
  CfdException *pCVar4;
  bool is_bitcoin;
  OutPoint outpoint;
  TransactionContext tx;
  SignParameter param;
  allocator local_1e2;
  bool local_1e1;
  string local_1e0;
  void *local_1c0;
  Pubkey local_1b8;
  OutPoint local_1a0;
  undefined1 local_178 [104];
  char local_110 [80];
  SigHashType local_c0;
  SigHashType local_b4;
  SignParameter local_a8;
  
  local_1c0 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_178._0_8_ = "cfdcapi_transaction.cpp";
    local_178._8_4_ = 0x668;
    local_178._16_8_ = "CfdAddPubkeyHashSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_178._0_8_ = "cfdcapi_transaction.cpp";
    local_178._8_4_ = 0x66e;
    local_178._16_8_ = "CfdAddPubkeyHashSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(pubkey);
  if (bVar2) {
    local_178._0_8_ = "cfdcapi_transaction.cpp";
    local_178._8_4_ = 0x674;
    local_178._16_8_ = "CfdAddPubkeyHashSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(signature);
  if (bVar2) {
    local_178._0_8_ = "cfdcapi_transaction.cpp";
    local_178._8_4_ = 0x67a;
    local_178._16_8_ = "CfdAddPubkeyHashSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_178._0_8_ = "cfdcapi_transaction.cpp";
    local_178._8_4_ = 0x680;
    local_178._16_8_ = "CfdAddPubkeyHashSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_178,kCfdLogLevelWarning,"tx output is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_178);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  address_type = cfd::capi::ConvertHashToAddressType(0);
  cfd::SignParameter::SignParameter(&local_a8);
  if (use_der_encode) {
    cfd::core::SigHashType::Create
              ((SigHashType *)&local_1e0,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    std::__cxx11::string::string((string *)local_178,signature,(allocator *)&local_1b8);
    cfd::core::ByteData::ByteData((ByteData *)&local_1a0,(string *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    cfd::core::SigHashType::SigHashType(&local_b4,(SigHashType *)&local_1e0);
    cfd::SignParameter::SignParameter
              ((SignParameter *)local_178,(ByteData *)&local_1a0,true,&local_b4);
    cfd::SignParameter::operator=(&local_a8,(SignParameter *)local_178);
    local_178._72_8_ = &PTR__ScriptOperator_00722da0;
    if ((char *)local_178._88_8_ != local_110) {
      operator_delete((void *)local_178._88_8_);
    }
    if ((pointer)local_178._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._32_8_);
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_1a0.txid_._vptr_Txid == (_func_int **)0x0) goto LAB_0042a13d;
  }
  else {
    std::__cxx11::string::string((string *)&local_1a0,signature,(allocator *)&local_1e0);
    cfd::core::SigHashType::SigHashType(&local_c0,kSigHashAll,false,false);
    cfd::SignParameter::SignParameter
              ((SignParameter *)local_178,(string *)&local_1a0,false,&local_c0);
    cfd::SignParameter::operator=(&local_a8,(SignParameter *)local_178);
    local_178._72_8_ = &PTR__ScriptOperator_00722da0;
    if ((char *)local_178._88_8_ != local_110) {
      operator_delete((void *)local_178._88_8_);
    }
    if ((pointer)local_178._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._32_8_);
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_1a0.txid_._vptr_Txid ==
        (_func_int **)
        ((long)&local_1a0.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U))
    goto LAB_0042a13d;
  }
  operator_delete(local_1a0.txid_._vptr_Txid);
LAB_0042a13d:
  local_1e1 = false;
  cfd::capi::ConvertNetType(net_type,&local_1e1);
  std::__cxx11::string::string((string *)&local_1e0,txid,(allocator *)&local_1b8);
  cfd::core::Txid::Txid((Txid *)local_178,&local_1e0);
  cfd::core::OutPoint::OutPoint(&local_1a0,(Txid *)local_178,vout);
  local_178._0_8_ = &PTR__Txid_00723450;
  if ((void *)CONCAT44(local_178._12_4_,local_178._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_178._12_4_,local_178._8_4_));
  }
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_1e1 == true) {
    std::__cxx11::string::string((string *)&local_1e0,tx_hex_string,(allocator *)&local_1b8);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_178,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_1e0,pubkey,&local_1e2);
    cfd::core::Pubkey::Pubkey(&local_1b8,&local_1e0);
    cfd::TransactionContext::AddPubkeyHashSign
              ((TransactionContext *)local_178,&local_1a0,&local_a8,&local_1b8,address_type);
    if (local_1b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e0,(AbstractTransaction *)local_178);
    pcVar3 = cfd::capi::CreateString(&local_1e0);
    *tx_string = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    cfd::TransactionContext::~TransactionContext((TransactionContext *)local_178);
  }
  else {
    std::__cxx11::string::string((string *)&local_1e0,tx_hex_string,(allocator *)&local_1b8);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_178,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_1e0,pubkey,&local_1e2);
    cfd::core::Pubkey::Pubkey(&local_1b8,&local_1e0);
    cfd::ConfidentialTransactionContext::AddPubkeyHashSign
              ((ConfidentialTransactionContext *)local_178,&local_1a0,&local_a8,&local_1b8,
               address_type);
    if (local_1b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e0,(AbstractTransaction *)local_178);
    pcVar3 = cfd::capi::CreateString(&local_1e0);
    *tx_string = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_178);
  }
  local_1a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_1a0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.op_code_.text_data_._M_dataplus._M_p != &local_a8.op_code_.text_data_.field_2) {
    operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_a8.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdAddPubkeyHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey, const char* signature,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(signature));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(signature));
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}